

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::AllocNodes(SQTable *this,SQInteger nSize)

{
  void *pvVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  _HashNode *n;
  SQInteger i;
  _HashNode *nodes;
  _HashNode *this_00;
  
  pvVar1 = sq_vm_malloc(0x12eb63);
  for (this_00 = (_HashNode *)0x0; (long)this_00 < in_RSI;
      this_00 = (_HashNode *)((long)&(this_00->val).super_SQObject._type + 1)) {
    lVar2 = (long)this_00 * 0x28;
    _HashNode::_HashNode(this_00);
    *(undefined8 *)((long)pvVar1 + lVar2 + 0x20) = 0;
  }
  *(long *)(in_RDI + 0x48) = in_RSI;
  *(void **)(in_RDI + 0x40) = pvVar1;
  *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x40) + (*(long *)(in_RDI + 0x48) + -1) * 0x28;
  return;
}

Assistant:

void SQTable::AllocNodes(SQInteger nSize)
{
    _HashNode *nodes=(_HashNode *)SQ_MALLOC(sizeof(_HashNode)*nSize);
    for(SQInteger i=0;i<nSize;i++){
        _HashNode &n = nodes[i];
        new (&n) _HashNode;
        n.next=NULL;
    }
    _numofnodes=nSize;
    _nodes=nodes;
    _firstfree=&_nodes[_numofnodes-1];
}